

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageModule.cpp
# Opt level: O2

MessageTemplate * __thiscall
ki::protocol::dml::MessageModule::get_message_template(MessageModule *this,string *name)

{
  size_type sVar1;
  mapped_type *ppMVar2;
  mapped_type pMVar3;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageTemplate_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageTemplate_*>_>_>
          ::count(&this->m_message_name_map,name);
  if (sVar1 == 1) {
    ppMVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageTemplate_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageTemplate_*>_>_>
              ::at(&this->m_message_name_map,name);
    pMVar3 = *ppMVar2;
  }
  else {
    pMVar3 = (MessageTemplate *)0x0;
  }
  return pMVar3;
}

Assistant:

const MessageTemplate *MessageModule::get_message_template(std::string name) const
	{
		if (m_message_name_map.count(name) == 1)
			return m_message_name_map.at(name);
		return nullptr;
	}